

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLinLin>::operator()
          (StairsRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImU32 IVar2;
  uint uVar3;
  GetterYs<double> *pGVar4;
  ImDrawVert *pIVar5;
  uint *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  int iVar9;
  long lVar10;
  ImVec2 IVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  pGVar4 = this->Getter;
  iVar9 = pGVar4->Count;
  lVar10 = (long)(((prim + 1 + pGVar4->Offset) % iVar9 + iVar9) % iVar9) * (long)pGVar4->Stride;
  iVar9 = this->Transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar9].Min;
  IVar11.x = (float)(GImPlot->Mx *
                     (((double)(prim + 1) * pGVar4->XScale + pGVar4->X0) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  IVar11.y = (float)(GImPlot->My[iVar9] *
                     (*(double *)((long)pGVar4->Ys + lVar10) -
                     GImPlot->CurrentPlot->YAxis[iVar9].Range.Min) + (double)IVar1.y);
  fVar12 = (this->P1).x;
  fVar13 = (this->P1).y;
  auVar15._0_4_ = ~-(uint)(IVar11.x <= fVar12) & (uint)IVar11.x;
  auVar15._4_4_ = ~-(uint)(IVar11.y <= fVar13) & (uint)IVar11.y;
  auVar15._8_4_ = ~-(uint)(fVar12 < IVar11.x) & (uint)IVar11.x;
  auVar15._12_4_ = ~-(uint)(fVar13 < IVar11.y) & (uint)IVar11.y;
  auVar7._4_4_ = (uint)fVar13 & -(uint)(IVar11.y <= fVar13);
  auVar7._0_4_ = (uint)fVar12 & -(uint)(IVar11.x <= fVar12);
  auVar7._8_4_ = (uint)fVar12 & -(uint)(fVar12 < IVar11.x);
  auVar7._12_4_ = (uint)fVar13 & -(uint)(fVar13 < IVar11.y);
  auVar15 = auVar15 | auVar7;
  fVar14 = (cull_rect->Min).y;
  auVar8._4_8_ = auVar15._8_8_;
  auVar8._0_4_ = -(uint)(auVar15._4_4_ < fVar14);
  auVar16._0_8_ = auVar8._0_8_ << 0x20;
  auVar16._8_4_ = -(uint)(auVar15._8_4_ < (cull_rect->Max).x);
  auVar16._12_4_ = -(uint)(auVar15._12_4_ < (cull_rect->Max).y);
  auVar17._4_4_ = -(uint)(fVar14 < auVar15._4_4_);
  auVar17._0_4_ = -(uint)((cull_rect->Min).x < auVar15._0_4_);
  auVar17._8_8_ = auVar16._8_8_;
  iVar9 = movmskps((int)lVar10,auVar17);
  if (iVar9 == 0xf) {
    fVar14 = fVar13 + this->HalfWeight;
    fVar13 = fVar13 - this->HalfWeight;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar5 = DrawList->_VtxWritePtr;
    (pIVar5->pos).x = fVar12;
    (pIVar5->pos).y = fVar14;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5->col = IVar2;
    pIVar5[1].pos.x = IVar11.x;
    pIVar5[1].pos.y = fVar13;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[1].col = IVar2;
    pIVar5[2].pos.x = fVar12;
    pIVar5[2].pos.y = fVar13;
    pIVar5[2].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[2].col = IVar2;
    pIVar5[3].pos.x = IVar11.x;
    pIVar5[3].pos.y = fVar14;
    pIVar5[3].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar5 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar6 = DrawList->_IdxWritePtr;
    *puVar6 = uVar3;
    puVar6[1] = uVar3 + 1;
    puVar6[2] = DrawList->_VtxCurrentIdx + 2;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar6[3] = uVar3;
    puVar6[4] = uVar3 + 1;
    puVar6[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar6 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar13 = IVar11.x - this->HalfWeight;
    fVar12 = this->HalfWeight + IVar11.x;
    fVar14 = (this->P1).y;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar5[4].pos.x = fVar13;
    pIVar5[4].pos.y = IVar11.y;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5->col = IVar2;
    pIVar5[1].pos.x = fVar12;
    pIVar5[1].pos.y = fVar14;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[1].col = IVar2;
    pIVar5[2].pos.x = fVar13;
    pIVar5[2].pos.y = fVar14;
    pIVar5[2].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[2].col = IVar2;
    pIVar5[3].pos.x = fVar12;
    pIVar5[3].pos.y = IVar11.y;
    pIVar5[3].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar5 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar6 = DrawList->_IdxWritePtr;
    *puVar6 = uVar3;
    puVar6[1] = uVar3 + 1;
    puVar6[2] = DrawList->_VtxCurrentIdx + 2;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar6[3] = uVar3;
    puVar6[4] = uVar3 + 1;
    puVar6[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar6 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar11;
  return (char)iVar9 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }